

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O1

void cmGhsMultiTargetGenerator::WriteObjectLangOverride(ostream *fout,cmSourceFile *sourceFile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  string *psVar4;
  string sourceLangProp;
  string local_48;
  
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"LANGUAGE","");
  __s = cmSourceFile::GetProperty(sourceFile,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (__s != (char *)0x0) {
    local_48._M_dataplus._M_p = (pointer)paVar1;
    sVar3 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,__s,__s + sVar3);
    psVar4 = cmSourceFile::GetExtension_abi_cxx11_(sourceFile);
    iVar2 = std::__cxx11::string::compare((char *)&local_48);
    if ((iVar2 == 0) &&
       ((iVar2 = std::__cxx11::string::compare((char *)psVar4), iVar2 == 0 ||
        (iVar2 = std::__cxx11::string::compare((char *)psVar4), iVar2 == 0)))) {
      std::__ostream_insert<char,std::char_traits<char>>(fout,"    -dotciscxx",0xe);
      std::ios::widen((char)fout->_vptr_basic_ostream[-3] + (char)fout);
      std::ostream::put((char)fout);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteObjectLangOverride(
  std::ostream& fout, const cmSourceFile* sourceFile)
{
  const char* rawLangProp = sourceFile->GetProperty("LANGUAGE");
  if (nullptr != rawLangProp) {
    std::string sourceLangProp(rawLangProp);
    std::string const& extension = sourceFile->GetExtension();
    if ("CXX" == sourceLangProp && ("c" == extension || "C" == extension)) {
      fout << "    -dotciscxx" << std::endl;
    }
  }
}